

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# private_impl.cpp
# Opt level: O0

void __thiscall raspicam::_private::Private_Impl::commitContrast(Private_Impl *this)

{
  MMAL_RATIONAL_T value;
  MMAL_STATUS_T MVar1;
  ostream *poVar2;
  long in_RDI;
  
  value.den = 100;
  value.num = *(int32_t *)(in_RDI + 0x2c);
  MVar1 = mmal_port_parameter_set_rational
                    (*(MMAL_PORT_T **)(*(long *)(in_RDI + 0x18) + 0x20),0x1002d,value);
  if (MVar1 != MMAL_SUCCESS) {
    poVar2 = std::operator<<((ostream *)&std::cout,"commitContrast");
    std::operator<<(poVar2,": Failed to set contrast parameter.\n");
  }
  return;
}

Assistant:

void Private_Impl::commitContrast() {
            if ( mmal_port_parameter_set_rational ( State.camera_component->control, MMAL_PARAMETER_CONTRAST, ( MMAL_RATIONAL_T ) {
            State.contrast, 100
        } ) != MMAL_SUCCESS )
            cout << __func__ << ": Failed to set contrast parameter.\n";
        }